

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ScopedLdInst<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  PropertyId propertyId;
  FunctionBody *this_00;
  RootObjectBase *rootObject_00;
  FrameDisplay *pScope;
  ScriptContext *scriptContext;
  Var value;
  Var result;
  Var rootObject;
  Var thisVar;
  OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  rootObject = (Var)0x0;
  thisVar = playout;
  playout_local = (OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *)this;
  this_00 = GetFunctionBody(this);
  rootObject_00 = FunctionBody::GetRootObject(this_00);
  pScope = GetEnvForEvalCode(this);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),(uint)*(ushort *)((long)thisVar + 4));
  scriptContext = GetScriptContext(this);
  value = Js::JavascriptOperators::OP_GetInstanceScoped
                    (pScope,propertyId,rootObject_00,&rootObject,scriptContext);
  SetReg<unsigned_short>(this,*thisVar,value);
  SetReg<unsigned_short>(this,*(unsigned_short *)((long)thisVar + 2),rootObject);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ScopedLdInst(const unaligned T * playout)
    {
        Var thisVar = nullptr;
        Var rootObject = GetFunctionBody()->GetRootObject();
        Var result = JavascriptOperators::OP_GetInstanceScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), rootObject, &thisVar, GetScriptContext());
        SetReg(playout->Value, result);
        SetReg(playout->Value2, thisVar);
    }